

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O3

void __thiscall DatabaseException::DatabaseException(DatabaseException *this,string *reason)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__DatabaseException_001d6d68;
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  pcVar1 = (reason->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->reason,pcVar1,pcVar1 + reason->_M_string_length);
  return;
}

Assistant:

explicit DatabaseException(std::string reason): reason(reason) {}